

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QByteArray * QFileSystemEngine::id(QFileSystemEntry *entry)

{
  bool bVar1;
  int base;
  int *piVar2;
  char *__file;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QByteArray *result;
  stat64 statResult;
  undefined7 in_stack_fffffffffffffe88;
  char in_stack_fffffffffffffe8f;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  QFileSystemEntry *this;
  stat64 local_98;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar1 = QFileSystemEntry::isEmpty
                    ((QFileSystemEntry *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  if (bVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    QByteArray::QByteArray((QByteArray *)0x210d6b);
  }
  else {
    bVar1 = qIsFilenameBroken((QFileSystemEntry *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if (bVar1) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      QByteArray::QByteArray((QByteArray *)0x210dc8);
    }
    else {
      memset(&local_98,0xaa,0x90);
      QFileSystemEntry::nativeFilePath(this);
      __file = QByteArray::constData((QByteArray *)0x210e05);
      base = stat64(__file,&local_98);
      QByteArray::~QByteArray((QByteArray *)0x210e26);
      if (base == 0) {
        (this->m_filePath).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (this->m_filePath).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        (this->m_filePath).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QByteArray::number((qulonglong)this,0);
        QByteArray::operator+=
                  ((QByteArray *)CONCAT44(base,in_stack_fffffffffffffe90),in_stack_fffffffffffffe8f)
        ;
        QByteArray::number((qulonglong)this,base);
        QByteArray::operator+=
                  ((QByteArray *)CONCAT44(base,in_stack_fffffffffffffe90),
                   (QByteArray *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
        QByteArray::~QByteArray((QByteArray *)0x210f14);
      }
      else {
        __errno_location();
        QByteArray::QByteArray((QByteArray *)0x210e94);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QFileSystemEngine::id(const QFileSystemEntry &entry)
{
    Q_CHECK_FILE_NAME(entry, QByteArray());

    QT_STATBUF statResult;
    if (QT_STAT(entry.nativeFilePath().constData(), &statResult)) {
        if (errno != ENOENT)
            qErrnoWarning("stat() failed for '%s'", entry.nativeFilePath().constData());
        return QByteArray();
    }
    QByteArray result = QByteArray::number(quint64(statResult.st_dev), 16);
    result += ':';
    result += QByteArray::number(quint64(statResult.st_ino));
    return result;
}